

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::StringMatcherBase::describe_abi_cxx11_(StringMatcherBase *this)

{
  long in_RSI;
  string *in_RDI;
  string *description;
  CasedString *in_stack_ffffffffffffff98;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  CasedString::caseSensitivitySuffix_abi_cxx11_(in_stack_ffffffffffffff98);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator+=((string *)in_RDI,": \"");
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator+=((string *)in_RDI,"\"");
  CasedString::caseSensitivitySuffix_abi_cxx11_(in_stack_ffffffffffffff98);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  return in_RDI;
}

Assistant:

std::string StringMatcherBase::describe() const {
            std::string description;
            description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                        m_comparator.caseSensitivitySuffix().size());
            description += m_operation;
            description += ": \"";
            description += m_comparator.m_str;
            description += "\"";
            description += m_comparator.caseSensitivitySuffix();
            return description;
        }